

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# offline-ekf-flexibility-estimation.hxx
# Opt level: O1

IndexedVectorArray *
stateObservation::examples::offlineEKFFlexibilityEstimation
          (IndexedVectorArray *__return_storage_ptr__,IndexedVectorArray *y,IndexedVectorArray *u,
          Vector *xh0,uint numberOfContacts,
          vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
          *contactsPositions,double dt,IndexedVectorArray *ino,IndexedVectorArray *premea)

{
  undefined4 *puVar1;
  ulong uVar2;
  pointer pMVar3;
  _Elt_pointer pMVar4;
  _Map_pointer ppMVar5;
  _Map_pointer ppMVar6;
  IndexedVectorArray *this;
  DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *v;
  value_type *__x;
  double *pdVar7;
  long lVar8;
  long lVar9;
  int iVar10;
  ulong uVar11;
  DenseStorage<double,__1,__1,_1,_0> *pDVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  long lVar16;
  undefined4 uVar17;
  undefined4 uVar18;
  Matrix Q;
  Matrix R;
  FixedContactEKFFlexEstimatorIMU estimator;
  assign_op<double,_double> local_5e9;
  Deque *local_5e8;
  Matrix<double,__1,__1,_0,__1,__1> local_5e0;
  IndexedVectorArray *local_5c8;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
  local_5c0;
  DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *local_598;
  Matrix<double,__1,__1,_0,__1,__1> local_590;
  undefined4 local_578;
  undefined4 uStack_574;
  undefined4 uStack_570;
  undefined4 uStack_56c;
  undefined8 local_568;
  FixedContactEKFFlexEstimatorIMU local_558 [1320];
  
  local_5e8 = (Deque *)contactsPositions;
  stateObservation::flexibilityEstimation::FixedContactEKFFlexEstimatorIMU::
  FixedContactEKFFlexEstimatorIMU(local_558,0.005);
  stateObservation::flexibilityEstimation::EKFFlexibilityEstimatorBase::getEKF();
  stateObservation::KalmanFilterBase::getRmatrixIdentity();
  if (-1 < (local_590.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
            m_cols | local_590.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                     m_storage.m_rows)) {
    local_5c0.m_rhs.m_rows.m_value =
         local_590.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows
    ;
    local_5c0.m_rhs.m_cols.m_value =
         local_590.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols
    ;
    local_5c0.m_rhs.m_functor.m_other = 1e-30;
    local_5c0.m_lhs = &local_590;
    Eigen::internal::
    call_dense_assignment_loop<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Matrix<double,_1,_1,0,_1,_1>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>const>const>,Eigen::internal::assign_op<double,double>>
              (&local_590,&local_5c0,(assign_op<double,_double> *)&local_5e0);
    stateObservation::flexibilityEstimation::EKFFlexibilityEstimatorBase::getEKF();
    stateObservation::KalmanFilterBase::getQmatrixIdentity();
    if (-1 < (local_5e0.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
              m_cols | local_5e0.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                       m_storage.m_rows)) {
      local_5c0.m_rhs.m_rows.m_value =
           local_5e0.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
           m_rows;
      local_5c0.m_rhs.m_cols.m_value =
           local_5e0.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
           m_cols;
      local_5c0.m_rhs.m_functor.m_other = 0.0001;
      local_5c0.m_lhs = &local_5e0;
      Eigen::internal::
      call_dense_assignment_loop<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Matrix<double,_1,_1,0,_1,_1>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>const>const>,Eigen::internal::assign_op<double,double>>
                (&local_5e0,&local_5c0,&local_5e9);
      if ((8 < local_5e0.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
               m_rows) &&
         (8 < local_5e0.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
              m_cols)) {
        pdVar7 = local_5e0.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                 m_storage.m_data +
                 local_5e0.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                 m_storage.m_rows * 6 + 6;
        lVar14 = 0;
        do {
          lVar16 = 0;
          do {
            uVar17 = 0xe2308c3a;
            uVar18 = 0x3e45798e;
            if (lVar14 != lVar16) {
              uVar17 = 0;
              uVar18 = 0;
            }
            pdVar7[lVar16] = (double)CONCAT44(uVar18,uVar17);
            lVar16 = lVar16 + 1;
          } while (lVar16 != 3);
          lVar14 = lVar14 + 1;
          pdVar7 = pdVar7 + local_5e0.
                            super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                            m_storage.m_rows;
        } while (lVar14 != 3);
        if ((0x11 < local_5e0.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                    m_storage.m_rows) &&
           (0x11 < local_5e0.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                   m_storage.m_cols)) {
          pdVar7 = local_5e0.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                   m_storage.m_data +
                   local_5e0.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                   m_storage.m_rows * 0xf + 0xf;
          lVar14 = 0;
          do {
            lVar16 = 0;
            do {
              uVar17 = 0xe2308c3a;
              uVar18 = 0x3e45798e;
              if (lVar14 != lVar16) {
                uVar17 = 0;
                uVar18 = 0;
              }
              pdVar7[lVar16] = (double)CONCAT44(uVar18,uVar17);
              lVar16 = lVar16 + 1;
            } while (lVar16 != 3);
            lVar14 = lVar14 + 1;
            pdVar7 = pdVar7 + local_5e0.
                              super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                              m_storage.m_rows;
          } while (lVar14 != 3);
          stateObservation::flexibilityEstimation::EKFFlexibilityEstimatorBase::
          setFlexibilityCovariance((Matrix *)local_558);
          stateObservation::flexibilityEstimation::FixedContactEKFFlexEstimatorIMU::
          setMeasurementNoiseCovariance((Matrix *)local_558);
          stateObservation::flexibilityEstimation::FixedContactEKFFlexEstimatorIMU::
          setProcessNoiseCovariance((Matrix *)local_558);
          stateObservation::flexibilityEstimation::FixedContactEKFFlexEstimatorIMU::
          setContactsNumber((uint)local_558);
          local_5c8 = __return_storage_ptr__;
          local_598 = (DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)xh0;
          if (numberOfContacts != 0) {
            lVar14 = 0;
            iVar10 = 0;
            do {
              pMVar3 = (((_Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                          *)&local_5e8->
                             super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                        )->_M_impl).super__Vector_impl_data._M_start;
              local_568 = *(undefined8 *)
                           ((long)&(pMVar3->
                                   super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).
                                   m_storage.m_data + lVar14 + 0x10);
              puVar1 = (undefined4 *)
                       ((long)&(pMVar3->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
                               ).m_storage.m_data + lVar14);
              local_578 = *puVar1;
              uStack_574 = puVar1[1];
              uStack_570 = puVar1[2];
              uStack_56c = puVar1[3];
              stateObservation::flexibilityEstimation::FixedContactEKFFlexEstimatorIMU::
              setContactPosition(local_558,iVar10,&local_578);
              iVar10 = iVar10 + 1;
              lVar14 = lVar14 + 0x18;
            } while ((ulong)numberOfContacts * 0x18 != lVar14);
          }
          v = local_598;
          Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
          PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>>
                    ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&local_5c0,local_598);
          stateObservation::flexibilityEstimation::FixedContactEKFFlexEstimatorIMU::
          setFlexibilityGuess((Matrix *)local_558);
          this = local_5c8;
          free(local_5c0.m_lhs);
          local_5e8 = &this->v_;
          (this->v_).
          super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
          ._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
          (this->v_).
          super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
          ._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
          (this->v_).
          super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
          ._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
          (this->v_).
          super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
          ._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
          (this->v_).
          super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
          ._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
          (this->v_).
          super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
          ._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
          (this->v_).
          super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
          ._M_impl.super__Deque_impl_data._M_map_size = 0;
          (this->v_).
          super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
          ._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
          this->k_ = 0;
          (this->v_).
          super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
          ._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
          (this->v_).
          super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
          ._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
          std::
          _Deque_base<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
          ::_M_initialize_map(&local_5e8->
                               super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                              ,0);
          IndexedMatrixArrayT<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
          ::setValue(this,(Matrix<double,__1,_1,_0,__1,_1> *)v,y->k_ + -1);
          lVar14 = y->k_;
          lVar16 = lVar14 << 4;
          while( true ) {
            lVar8 = y->k_;
            pMVar4 = (y->v_).
                     super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                     ._M_impl.super__Deque_impl_data._M_start._M_cur;
            ppMVar5 = (y->v_).
                      super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                      ._M_impl.super__Deque_impl_data._M_finish._M_node;
            ppMVar6 = (y->v_).
                      super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                      ._M_impl.super__Deque_impl_data._M_start._M_node;
            lVar9 = ((((ulong)((long)ppMVar5 - (long)ppMVar6) >> 3) - 1) +
                    (ulong)(ppMVar5 == (_Map_pointer)0x0)) * 0x20;
            lVar13 = (long)(y->v_).
                           super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                           ._M_impl.super__Deque_impl_data._M_finish._M_cur -
                     (long)(y->v_).
                           super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                           ._M_impl.super__Deque_impl_data._M_finish._M_first >> 4;
            lVar15 = (long)(y->v_).
                           super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                           ._M_impl.super__Deque_impl_data._M_start._M_last - (long)pMVar4 >> 4;
            if (lVar13 + lVar8 + lVar15 + lVar9 <= lVar14) {
              free(local_5e0.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                   m_storage.m_data);
              free(local_590.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                   m_storage.m_data);
              stateObservation::flexibilityEstimation::FixedContactEKFFlexEstimatorIMU::
              ~FixedContactEKFFlexEstimatorIMU(local_558);
              return local_5c8;
            }
            if ((lVar9 + lVar13 + lVar15 == 0) || (lVar14 < lVar8)) break;
            lVar9 = ((long)pMVar4 -
                     (long)(y->v_).
                           super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                           ._M_impl.super__Deque_impl_data._M_start._M_first >> 4) - lVar8;
            uVar2 = lVar14 + lVar9;
            if (uVar2 < 0x20) {
              pDVar12 = (DenseStorage<double,__1,__1,_1,_0> *)
                        ((long)&pMVar4[-lVar8].
                                super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                                m_storage.m_data + lVar16);
            }
            else {
              uVar11 = uVar2 >> 5 | 0xf800000000000000;
              if (0 < (long)uVar2) {
                uVar11 = uVar2 >> 5;
              }
              pDVar12 = (DenseStorage<double,__1,__1,_1,_0> *)
                        (ppMVar6[uVar11] + lVar9 + uVar11 * -0x20 + lVar14);
            }
            Eigen::DenseStorage<double,_-1,_-1,_1,_0>::DenseStorage
                      ((DenseStorage<double,__1,__1,_1,_0> *)&local_5c0,pDVar12);
            stateObservation::flexibilityEstimation::FixedContactEKFFlexEstimatorIMU::setMeasurement
                      ((Matrix *)local_558);
            free(local_5c0.m_lhs);
            ppMVar5 = (u->v_).
                      super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                      ._M_impl.super__Deque_impl_data._M_finish._M_node;
            ppMVar6 = (u->v_).
                      super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                      ._M_impl.super__Deque_impl_data._M_start._M_node;
            pMVar4 = (u->v_).
                     super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                     ._M_impl.super__Deque_impl_data._M_start._M_cur;
            lVar8 = ((long)(u->v_).
                           super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                           ._M_impl.super__Deque_impl_data._M_start._M_last - (long)pMVar4 >> 4) +
                    ((long)(u->v_).
                           super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                           ._M_impl.super__Deque_impl_data._M_finish._M_cur -
                     (long)(u->v_).
                           super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                           ._M_impl.super__Deque_impl_data._M_finish._M_first >> 4) +
                    ((((ulong)((long)ppMVar5 - (long)ppMVar6) >> 3) - 1) +
                    (ulong)(ppMVar5 == (_Map_pointer)0x0)) * 0x20;
            if (((lVar8 == 0) || (lVar9 = u->k_, lVar14 < lVar9)) || (lVar8 + lVar9 <= lVar14))
            break;
            lVar8 = ((long)pMVar4 -
                     (long)(u->v_).
                           super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                           ._M_impl.super__Deque_impl_data._M_start._M_first >> 4) - lVar9;
            uVar2 = lVar14 + lVar8;
            if (uVar2 < 0x20) {
              pDVar12 = (DenseStorage<double,__1,__1,_1,_0> *)
                        ((long)&pMVar4[-lVar9].
                                super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                                m_storage.m_data + lVar16);
            }
            else {
              uVar11 = uVar2 >> 5 | 0xf800000000000000;
              if (0 < (long)uVar2) {
                uVar11 = uVar2 >> 5;
              }
              pDVar12 = (DenseStorage<double,__1,__1,_1,_0> *)
                        (ppMVar6[uVar11] + lVar8 + uVar11 * -0x20 + lVar14);
            }
            Eigen::DenseStorage<double,_-1,_-1,_1,_0>::DenseStorage
                      ((DenseStorage<double,__1,__1,_1,_0> *)&local_5c0,pDVar12);
            stateObservation::flexibilityEstimation::EKFFlexibilityEstimatorBase::
            setMeasurementInput((Matrix *)local_558);
            free(local_5c0.m_lhs);
            __x = (value_type *)
                  stateObservation::flexibilityEstimation::FixedContactEKFFlexEstimatorIMU::
                  getFlexibilityVector();
            std::
            deque<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
            ::push_back(local_5e8,__x);
            if (ino != (IndexedVectorArray *)0x0) {
              stateObservation::flexibilityEstimation::EKFFlexibilityEstimatorBase::getInnovation();
              IndexedMatrixArrayT<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
              ::setValue(ino,(Matrix<double,__1,_1,_0,__1,_1> *)&local_5c0,lVar14);
              free(local_5c0.m_lhs);
            }
            if (premea != (IndexedVectorArray *)0x0) {
              stateObservation::flexibilityEstimation::EKFFlexibilityEstimatorBase::
              getLastPredictedMeasurement();
              IndexedMatrixArrayT<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
              ::setValue(premea,(Matrix<double,__1,_1,_0,__1,_1> *)&local_5c0,lVar14);
              free(local_5c0.m_lhs);
            }
            lVar14 = lVar14 + 1;
            lVar16 = lVar16 + 0x10;
          }
          __assert_fail("checkIndex(time) && \"Error: Time out of range\"",
                        "/workspace/llm4binary/github/license_c_cmakelists/mehdi-benallegue[P]state-observation/include/state-observation/tools/definitions.hxx"
                        ,0x192,
                        "void stateObservation::IndexedMatrixArrayT<Eigen::Matrix<double, -1, 1>>::check_(TimeIndex) const [MatrixType = Eigen::Matrix<double, -1, 1>, Allocator = std::allocator<Eigen::Matrix<double, -1, 1>>]"
                       );
        }
      }
      __assert_fail("startRow >= 0 && blockRows >= 0 && startRow <= xpr.rows() - blockRows && startCol >= 0 && blockCols >= 0 && startCol <= xpr.cols() - blockCols"
                    ,"/usr/include/eigen3/Eigen/src/Core/Block.h",0x93,
                    "Eigen::Block<Eigen::Matrix<double, -1, -1>>::Block(XprType &, Index, Index, Index, Index) [XprType = Eigen::Matrix<double, -1, -1>, BlockRows = -1, BlockCols = -1, InnerPanel = false]"
                   );
    }
  }
  __assert_fail("rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols)"
                ,"/usr/include/eigen3/Eigen/src/Core/CwiseNullaryOp.h",0x4a,
                "Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Matrix<double, -1, -1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_constant_op<double>, MatrixType = const Eigen::Matrix<double, -1, -1>]"
               );
}

Assistant:

stateObservation::IndexedVectorArray offlineEKFFlexibilityEstimation(
            const stateObservation::IndexedVectorArray & y,
            const stateObservation::IndexedVectorArray & u,
            const Vector & xh0,
            unsigned numberOfContacts,
            const std::vector<Vector3,Eigen::aligned_allocator<Vector3> > & contactsPositions,
            double dt,
            IndexedVectorArray * ino,
            IndexedVectorArray * premea)
{

    (void)dt;
        ///Sizes of the states for the state, the measurement, and the input vector

    flexibilityEstimation::FixedContactEKFFlexEstimatorIMU estimator;


    Matrix R(estimator.getEKF().getRmatrixIdentity());
    R=R*1.e-30;

    Matrix Q(estimator.getEKF().getQmatrixIdentity());
    Q=Q*1.e-4;
    Q.block(6,6,3,3)=Matrix3::Identity()*1.e-8;
    Q.block(15,15,3,3)=Matrix3::Identity()*1.e-8;


    estimator.setFlexibilityCovariance(Q);
    estimator.setMeasurementNoiseCovariance(R);
    estimator.setProcessNoiseCovariance(Q);


    estimator.setContactsNumber(numberOfContacts);

    for (unsigned i = 0; i<numberOfContacts ; ++i)
    {
        estimator.setContactPosition(i,contactsPositions[i]);
    }

    ///
    estimator.setFlexibilityGuess(xh0);

    ///the array of the state estimations over time
    stateObservation::IndexedVectorArray xh;
    xh.setValue(xh0,y.getFirstIndex()-1);

    ///the reconstruction of the state
    for (TimeIndex i=y.getFirstIndex();i<y.getNextIndex();++i)
    {
        //std::cout << i << std::endl;

        ///introduction of the measurement
        estimator.setMeasurement(y[i]);

        estimator.setMeasurementInput(u[i]);

        ///get the estimation and give it to the array
        xh.pushBack(estimator.getFlexibilityVector());

        if (ino != 0)
        {
            ino->setValue(estimator.getInnovation(),i);
        }

        if (premea != 0)
        {
            premea->setValue(estimator.getLastPredictedMeasurement(),i);
        }

    }

    return xh;
}